

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sophia_interface.cpp
# Opt level: O3

int __thiscall sophia_interface::KLU(sophia_interface *this,int I,int J)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  undefined1 uVar11;
  undefined7 uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  double dVar17;
  double __y;
  
  uVar11 = SUB81(this,0);
  uVar12 = (undefined7)((ulong)this >> 8);
  if (I < 0) {
    return 0;
  }
  if (J < 1) {
    return 0;
  }
  uVar15 = (ulong)(uint)I;
  if (MSTU[3] < I) {
    return 0;
  }
  if (J == 1 && I == 0) {
    return this->N;
  }
  if (I == 0) {
    if ((J | 4U) != 6) {
      return 0;
    }
    iVar3 = this->N;
    if (iVar3 < 1) {
      return 0;
    }
    lVar14 = 0;
    iVar16 = 0;
    do {
      if (J == 6) {
        if (this->K[0][lVar14] - 1U < 10) {
          iVar3 = LUCHGE((sophia_interface *)CONCAT71(uVar12,uVar11),this->K[1][lVar14]);
          iVar16 = iVar16 + iVar3;
          iVar3 = this->N;
        }
      }
      else if (J == 2) {
        iVar16 = iVar16 + (uint)(this->K[0][lVar14] - 1U < 10);
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < iVar3);
    return iVar16;
  }
  if ((uint)J < 6) {
    return this->K[J - 1][I - 1];
  }
  if (J == 6) {
    iVar3 = LUCHGE(this,this->K[1][I - 1]);
    return iVar3;
  }
  if ((uint)J < 9) {
    uVar4 = this->K[0][I - 1U] - 1;
    if (J != 8) {
      return (uint)(uVar4 < 10);
    }
    if (9 < uVar4) {
      return 0;
    }
    return this->K[1][I - 1U];
  }
  if ((uint)J < 0xd) {
    iVar3 = this->K[1][I - 1];
    iVar16 = -iVar3;
    if (0 < iVar3) {
      iVar16 = iVar3;
    }
    iVar5 = LUCOMP(this,iVar16);
    iVar16 = 0;
    if (iVar5 != 0) {
      iVar16 = KCHG[0][(long)iVar5 + 499];
      if ((J == 9) && (iVar16 != 0)) {
        return iVar3;
      }
      if ((J == 10) && (iVar16 == 0)) {
        return iVar3;
      }
    }
    iVar13 = 0;
    if (J == 0xb) {
      iVar13 = iVar5;
    }
    if (J != 0xc) {
      return iVar13;
    }
    if (iVar3 < 0) {
      return -iVar16;
    }
    return iVar16;
  }
  if (J == 0xd) {
    uVar4 = this->K[1][I - 1U];
    uVar8 = -uVar4;
    if (0 < (int)uVar4) {
      uVar8 = uVar4;
    }
    __y = (double)(int)(uVar8 / 100 + (uVar8 / 1000) * -10);
    dVar17 = pow(-1.0,__y);
    uVar4 = (int)(dVar17 * __y);
    if (uVar8 < 10) {
      uVar4 = uVar8;
    }
    uVar8 = uVar8 / 1000 + (uVar8 / 10000) * -10;
    if (uVar8 == 0) {
      uVar8 = uVar4;
    }
    if (this->K[1][I - 1U] < 0) {
      return -uVar8;
    }
    return uVar8;
  }
  if ((uint)J < 0x10) {
    iVar3 = 1;
    do {
      iVar5 = iVar3;
      iVar16 = (int)uVar15;
      uVar4 = this->K[2][iVar16 - 1];
      uVar15 = (ulong)uVar4;
      if ((int)uVar4 < 1) break;
      iVar3 = iVar5 + 1;
    } while (this->K[0][uVar4 - 1] - 1U < 0x14);
    if (J != 0xf) {
      return iVar5;
    }
    return iVar16;
  }
  if (J == 0x10) {
    uVar4 = this->K[1][I - 1U];
    uVar8 = -uVar4;
    if (0 < (int)uVar4) {
      uVar8 = uVar4;
    }
    if (0x14 < this->K[0][I - 1U]) {
      return 0;
    }
    if (uVar8 != 0x16 && 9 < uVar8 - 0xb) {
      if (uVar8 < 0x65) {
        return 0;
      }
      uVar4 = (uVar8 / 10) * -0x33333333;
      if ((uVar4 >> 1 | (uint)((uVar4 & 1) != 0) << 0x1f) < 0x1999999a) {
        return 0;
      }
    }
    do {
      uVar7 = uVar15 & 0xffffffff;
      iVar16 = (int)uVar15;
      iVar3 = this->K[2][iVar16 - 1];
      uVar15 = (ulong)iVar3;
      if ((long)uVar15 < 1) break;
      uVar4 = this->K[1][iVar3 - 1];
      uVar8 = -uVar4;
      if (0 < (int)uVar4) {
        uVar8 = uVar4;
      }
    } while (10 < uVar8);
    if (*(int *)((long)(this->K + -1) + 0x3e7c + uVar15 * 4) == 0xc) {
      if (iVar16 <= iVar3) {
        return 0;
      }
      iVar16 = 0;
      do {
        if (this->K[2][uVar15] == iVar3) {
          iVar16 = iVar16 + (uint)(this->K[1][uVar15] - 0x5eU < 0xfffffffd);
        }
        uVar15 = uVar15 + 1;
      } while (uVar7 != uVar15);
      return iVar16;
    }
    lVar14 = 0;
    do {
      iVar5 = (int)lVar14;
      if (this->N <= iVar5 + iVar16 + 1) break;
      lVar2 = uVar7 + lVar14;
      lVar14 = lVar14 + 1;
    } while (this->K[2][lVar2] == iVar3);
    return iVar5 + 1;
  }
  if (J == 0x12) {
    uVar4 = I - 1;
    if (this->K[0][uVar4] - 0xbU < 2) {
      iVar3 = this->K[3][uVar4];
      iVar5 = this->K[4][uVar4] - iVar3;
      iVar16 = -1;
      if (-1 < iVar5) {
        iVar16 = iVar5;
      }
      iVar16 = iVar16 + 1;
    }
    else {
      iVar3 = this->K[3][uVar4];
      iVar16 = 0;
    }
    if ((iVar3 != 0) && (this->K[4][uVar4] != 0)) {
      return iVar16;
    }
    return 0;
  }
  if (J == 0x11) {
    iVar3 = 0;
    do {
      iVar13 = (int)uVar15;
      iVar16 = this->K[1][(long)iVar13 + 3999];
      uVar15 = (ulong)iVar16;
      iVar5 = 1;
      if (1 < iVar16) {
        iVar5 = iVar16;
      }
      iVar6 = LUCOMP((sophia_interface *)CONCAT71(uVar12,uVar11),this->K[1][iVar5 - 1U]);
      if ((((uVar15 == 0) || (uVar4 = this->K[0][iVar5 - 1U], (int)uVar4 < 1)) || (iVar6 == 0)) ||
         (0x14 < uVar4)) {
        uVar4 = -(iVar3 + -1) | -(uint)(iVar3 == 0);
        if ((int)uVar4 < 2) {
          return uVar4;
        }
        return 0;
      }
      iVar3 = iVar3 + -1;
    } while (KCHG[0][(long)iVar6 + 499] == 0);
    if (*(int *)((long)(this->K + -1) + 0x3e7c + uVar15 * 4) != 0xc) {
      return 0;
    }
    iVar5 = this->N;
    iVar9 = iVar16;
    iVar6 = iVar16 + 1;
    if (iVar16 + 1 < iVar5) {
      iVar6 = iVar5;
    }
    do {
      iVar10 = iVar6;
      if ((long)iVar5 <= (long)(uVar15 + 1)) break;
      iVar10 = iVar9 + 1;
      piVar1 = this->K[0] + uVar15;
      iVar9 = iVar10;
      uVar15 = uVar15 + 1;
    } while (*piVar1 != 0xb);
    iVar6 = this->K[1][(long)iVar13 + 0xf9e];
    iVar9 = this->K[2][iVar13];
    iVar3 = -iVar3;
    if (iVar6 <= iVar10 && iVar16 <= iVar6) {
      iVar3 = 0;
    }
    iVar6 = 0;
    if (iVar10 < iVar9 || iVar9 < iVar16) {
      iVar6 = iVar3;
    }
    if (iVar13 < iVar5) {
      return iVar6;
    }
    return iVar3;
  }
  if (0x16 < (uint)J) {
    return 0;
  }
  uVar8 = I - 1;
  uVar4 = this->K[0][uVar8];
  if (0xe < uVar4) {
    return 0;
  }
  if ((0x6008U >> (uVar4 & 0x1f) & 1) == 0) {
    return 0;
  }
  if (J == 0x15) {
    iVar3 = this->K[3][uVar8];
  }
  else {
    if (J == 0x14) {
      iVar3 = this->K[4][uVar8];
    }
    else {
      if (J != 0x13) {
        iVar3 = this->K[4][uVar8];
        goto LAB_0010e865;
      }
      iVar3 = this->K[3][uVar8];
    }
    iVar3 = iVar3 / MSTU[4];
  }
LAB_0010e865:
  return iVar3 % MSTU[4];
}

Assistant:

int sophia_interface::KLU(int I, int J) {
// Purpose: to provide various integer-valued event related data.
    // Default value. For I=0 number of entries, number of stable entries
    // or 3 times total charge.
    int result = 0;
    int KFA = 0;
    int KC = 0;
    if (I < 0 || I > MSTU[3] || J <= 0) {
        // do nothing
    } else if (I == 0 && J == 1) {
        result = N;
    } else if (I == 0 && (J == 2 || J == 6)) {
        for (int I1 = 0; I1 < N; ++I1) {
            if (J == 2 && K[0][I1] >= 1 && K[0][I1] <= 10) result++;
            if (J == 6 && K[0][I1] >= 1 && K[0][I1] <= 10) result += LUCHGE(K[1][I1]);
        }
    } else if (I == 0) {
        // do nothing
    // For I > 0 direct readout of K matrix or charge.
    } else if (J <= 5) {
        result = K[J - 1][I - 1];
    } else if (J == 6) {
        result = LUCHGE(K[1][I - 1]);

    // Status (existing/fragmented/decayed), parton/hadron separation.
    } else if (J <= 8) {
        if (K[0][I - 1] >= 1 && K[0][I - 1] <= 10) result = 1;
        if (J == 8) result *= K[1][I - 1];
    } else if (J <= 12) {
        KFA = std::abs(K[1][I - 1]);
        KC = LUCOMP(KFA);
        int KQ = 0;
        if (KC != 0) KQ = KCHG[1][KC - 1];
        if (J == 9 && KC != 0 && KQ != 0) result = K[1][I - 1];
        if (J == 10 && KC != 0 && KQ == 0) result = K[1][I - 1];
        if (J == 11) result = KC;
        if (J == 12) {
            int sgn = (K[1][I - 1] < 0)? -1 : 1;
            result = KQ * sgn;
        }

    // Heaviest flavour in hadron/diquark.
    } else if (J == 13) {
        KFA = std::abs(K[1][I - 1]);
        result = (KFA / 100) % 10 * std::pow(-1, (KFA / 100) % 10);
        if (KFA < 10) result = KFA;
        if ((KFA / 1000) % 10 != 0) result = (KFA / 1000) % 10;
        int sgn = (K[1][I - 1] < 0)? -1 : 1;
        result = result * sgn;

    // Particle history: generation, ancestor, rank.
    } else if (J <= 15) {
        int I2 = I;
        int I1 = I;
        do {
            result++;
            I2 = I1;
            I1 = K[2][I1 - 1];
        } while (I1 > 0 && K[0][I1 - 1] > 0 && K[0][I1 - 1] <= 20);
        if (J == 15) result = I2;
    } else if (J == 16) {
        KFA = std::abs(K[1][I - 1]);
        if (K[0][I - 1] <= 20 && ((KFA >= 11 && KFA <= 20) || KFA == 22 || (KFA > 100 && (KFA / 10) % 10 != 0))) {
            int I1 = I;
            int ILP = 1;
            int I2 = I1;
            do {
                I2 = I1;
                I1 = K[2][I1 - 1];
                if (I1 > 0) {
                    int KFAM = std::abs(K[1][I1 - 1]);
                    if (KFAM =! 0 && KFAM <= 10) ILP = 0;
                    if (KFAM == 21 || KFAM == 91 || KFAM == 92 || KFAM == 93) ILP = 0;
                    if (KFAM > 100 && (KFAM / 10) % 10 == 0) ILP = 0;
                }
            } while (ILP == 1 && I1 > 0);

            if (K[0][I1 - 1] == 12) {
                for (int I3 = I1; I3 < I2; ++I3) {
                    if (K[2][I3] == K[2][I2 - 1] && K[1][I3] != 91 && K[1][I3] != 92 && K[1][I3] != 93) result++;
                }
            } else {
                int I3 = I2;
                do {
                    result++;
                    I3++;
                } while (I3 < N && K[2][I3 - 1] == K[2][I2 - 1]);
            }
        }

    // Particle coming from collapsing jet system or not.
    } else if (J == 17) {
        int I1 = I;
        int I3 = I1;
        do {
            result++;
            I3 = I1;
            I1 = K[2][I1 - 1];
            int I0 = std::max(1, I1);
            KC = LUCOMP(K[1][I0 - 1]);
            if (I1 == 0 || K[0][I0 - 1] <= 0 || K[0][I0 - 1] > 20 || KC == 0) {
                if (result == 1) result = -1;
                if (result > 1) result = 0;
                return result;
            }
        } while (KCHG[1][KC - 1] == 0);
        if (K[0][I1 - 1] != 12) return 0;
        int I2 = I1;
        do {
            I2++;
        } while (I2 < N && K[0][I2 - 1] != 11);
        int K3M = K[2][I3 - 2];
        if (K3M >= I1 && K3M <= I2) result = 0;
        int K3P = K[2][I3];
        if (I3 < N && K3P >= I1 && K3P <= I2) result = 0;

    // Number of decay products. Colour flow.
    } else if (J == 18) {
        if (K[0][I - 1] == 11 || K[0][I - 1] == 12) result = std::max(0, K[4][I - 1] - K[3][I - 1] + 1);
        if (K[3][I - 1] == 0 || K[4][I - 1] == 0) result = 0;
    } else if (J <= 22) {
        if (K[0][I - 1] != 3 && K[0][I - 1] != 13 && K[0][I - 1] != 14) return result; 
        if (J == 19) result = (K[3][I - 1] / MSTU[4]) % MSTU[4];
        if (J == 20) result = (K[4][I - 1] / MSTU[4]) % MSTU[4];
        if (J == 21) result = K[3][I - 1] % MSTU[4];
        if (J == 22) result = K[4][I - 1] % MSTU[4];
    }

    return result;
}